

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O0

void __thiscall ser::Savepoint::FromJSON(Savepoint *this,JSONNode *node)

{
  bool bVar1;
  JSONNode *pJVar2;
  char *pcVar3;
  json_string local_2a8;
  json_string local_288;
  JSONNode local_268;
  JSONNode local_260;
  const_iterator iter;
  ostringstream ss;
  SerializationException exception;
  out_of_range *anon_var_0;
  allocator local_59;
  json_string local_58;
  json_string local_38;
  JSONNode *local_18;
  JSONNode *node_local;
  Savepoint *this_local;
  
  local_18 = node;
  node_local = (JSONNode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"__name",&local_59);
  pJVar2 = ::JSONNode::at(node,&local_58);
  ::JSONNode::as_string_abi_cxx11_(&local_38,pJVar2);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  MetainfoSet::Cleanup(&this->metainfo_);
  ::JSONNode::begin(&local_260);
  while( true ) {
    ::JSONNode::end(&local_268);
    bVar1 = ::JSONNode::const_iterator::operator!=
                      ((const_iterator *)&local_260,(const_iterator *)&local_268);
    if (!bVar1) break;
    pJVar2 = ::JSONNode::const_iterator::operator->((const_iterator *)&local_260);
    ::JSONNode::name_abi_cxx11_(&local_288,pJVar2);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&local_288);
    bVar1 = false;
    if (*pcVar3 == '_') {
      pJVar2 = ::JSONNode::const_iterator::operator->((const_iterator *)&local_260);
      ::JSONNode::name_abi_cxx11_(&local_2a8,pJVar2);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&local_2a8);
      bVar1 = *pcVar3 == '_';
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    std::__cxx11::string::~string((string *)&local_288);
    if (!bVar1) {
      pJVar2 = ::JSONNode::const_iterator::operator*((const_iterator *)&local_260);
      MetainfoSet::AddNode(&this->metainfo_,pJVar2);
    }
    ::JSONNode::const_iterator::operator++((const_iterator *)&local_260);
  }
  return;
}

Assistant:

void Savepoint::FromJSON(const JSONNode& node)
{
    // Name
    try
    {
        name_ = node.at("__name").as_string();
    }
    catch(std::out_of_range&)
    {
        SerializationException exception;
        std::ostringstream ss;
        ss << "Error: Savepoint node does not have a name:\n"
           << node.write_formatted() << "\n";
        exception.Init(ss.str());
        throw exception;
    }

    // Metainfo
    // Nodes whose name starts with __ are skipped
    metainfo_.Cleanup();
    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
        if (!(iter->name()[0] == '_' && iter->name()[1] == '_'))
            metainfo_.AddNode(*iter);
}